

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llex.c
# Opt level: O1

int read_numeral(LexState *ls,SemInfo *seminfo)

{
  ZIO *pZVar1;
  byte *pbVar2;
  uint uVar3;
  int iVar4;
  size_t sVar5;
  char *set;
  TValue obj;
  Value local_40;
  int local_38;
  
  iVar4 = ls->current;
  save(ls,iVar4);
  pZVar1 = ls->z;
  sVar5 = pZVar1->n;
  pZVar1->n = pZVar1->n - 1;
  if (sVar5 == 0) {
    uVar3 = luaZ_fill(pZVar1);
  }
  else {
    pbVar2 = (byte *)pZVar1->p;
    pZVar1->p = (char *)(pbVar2 + 1);
    uVar3 = (uint)*pbVar2;
  }
  ls->current = uVar3;
  if (iVar4 == 0x30) {
    iVar4 = check_next2(ls,"xX");
    set = "Pp";
    if (iVar4 == 0) {
      set = "Ee";
    }
  }
  else {
    set = "Ee";
  }
  do {
    iVar4 = check_next2(ls,set);
    if (iVar4 != 0) {
      check_next2(ls,"-+");
    }
    iVar4 = ls->current;
    if ((""[(long)iVar4 + 1] & 0x10) == 0) {
      if (iVar4 != 0x2e) {
        save(ls,0);
        sVar5 = luaO_str2num(ls->buff->buffer,(TValue *)&local_40);
        if (sVar5 == 0) {
          lexerror(ls,"malformed number",0x122);
        }
        *seminfo = (SemInfo)local_40;
        return local_38 == 0x13 | 0x122;
      }
      iVar4 = 0x2e;
    }
    save(ls,iVar4);
    pZVar1 = ls->z;
    sVar5 = pZVar1->n;
    pZVar1->n = pZVar1->n - 1;
    if (sVar5 == 0) {
      uVar3 = luaZ_fill(pZVar1);
    }
    else {
      pbVar2 = (byte *)pZVar1->p;
      pZVar1->p = (char *)(pbVar2 + 1);
      uVar3 = (uint)*pbVar2;
    }
    ls->current = uVar3;
  } while( true );
}

Assistant:

static int read_numeral (LexState *ls, SemInfo *seminfo) {
  TValue obj;
  const char *expo = "Ee";
  int first = ls->current;
  lua_assert(lisdigit(ls->current));
  save_and_next(ls);
  if (first == '0' && check_next2(ls, "xX"))  /* hexadecimal? */
    expo = "Pp";
  for (;;) {
    if (check_next2(ls, expo))  /* exponent part? */
      check_next2(ls, "-+");  /* optional exponent sign */
    if (lisxdigit(ls->current))
      save_and_next(ls);
    else if (ls->current == '.')
      save_and_next(ls);
    else break;
  }
  save(ls, '\0');
  if (luaO_str2num(luaZ_buffer(ls->buff), &obj) == 0)  /* format error? */
    lexerror(ls, "malformed number", TK_FLT);
  if (ttisinteger(&obj)) {
    seminfo->i = ivalue(&obj);
    return TK_INT;
  }
  else {
    lua_assert(ttisfloat(&obj));
    seminfo->r = fltvalue(&obj);
    return TK_FLT;
  }
}